

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

bool __thiscall anon_unknown.dwarf_2c8643::Db::consumeIf(Db *this,StringView S)

{
  bool bVar1;
  StringView local_28;
  
  local_28.First = this->First;
  local_28.Last = this->Last;
  bVar1 = StringView::startsWith(&local_28,S);
  if (bVar1) {
    this->First = S.Last + ((long)this->First - (long)S.First);
  }
  return bVar1;
}

Assistant:

bool consumeIf(StringView S) {
    if (StringView(First, Last).startsWith(S)) {
      First += S.size();
      return true;
    }
    return false;
  }